

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O0

void __thiscall
axl::sys::NameableEventBase<axl::sl::True>::NameableEventBase
          (NameableEventBase<axl::sl::True> *this)

{
  undefined8 *in_RDI;
  NameableEventBase<axl::sl::True> *this_00;
  
  this_00 = (NameableEventBase<axl::sl::True> *)(in_RDI + 1);
  io::psx::Mapping::Mapping((Mapping *)this_00);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x12e494);
  *in_RDI = 0;
  create(this_00);
  return;
}

Assistant:

NameableEventBase() {
		m_event = NULL;
		create();
	}